

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *formatters,int numFormatters)

{
  uint *puVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  FormatArg *pFVar4;
  char *pcVar5;
  long lVar6;
  bool spacePadPositive;
  int ntrunc;
  string result;
  ostringstream tmpStream;
  bool local_1fa;
  undefined1 local_1f9;
  int local_1f8;
  int local_1f4;
  undefined4 local_1f0;
  int local_1ec;
  undefined8 local_1e8;
  undefined8 local_1e0;
  ostream *local_1d8;
  FormatArg *local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  p_Var2 = out->_vptr_basic_ostream[-3];
  local_1e0 = *(undefined8 *)(&out->field_0x8 + (long)p_Var2);
  local_1e8 = *(undefined8 *)(&out->field_0x10 + (long)p_Var2);
  local_1f0 = *(undefined4 *)(&out->field_0x18 + (long)p_Var2);
  local_1d0 = formatters;
  local_1f9 = std::ios::fill();
  local_1f4 = 0;
  local_1ec = numFormatters;
  local_1d8 = out;
  while( true ) {
    if (numFormatters <= local_1f4) {
      pcVar5 = printFormatStringLiteral(out,fmt);
      if (*pcVar5 == '\0') {
        pp_Var3 = out->_vptr_basic_ostream;
        *(undefined8 *)(&out->field_0x10 + (long)pp_Var3[-3]) = local_1e8;
        *(undefined8 *)(&out->field_0x8 + (long)pp_Var3[-3]) = local_1e0;
        *(undefined4 *)(&out->field_0x18 + (long)pp_Var3[-3]) = local_1f0;
        p_Var2 = pp_Var3[-3];
        std::ios::fill();
        (&out->field_0xe0)[(long)p_Var2] = local_1f9;
        return;
      }
      __assert_fail("0 && \"tinyformat: Too many conversion specifiers in format string\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                    ,0x342,
                    "void tinyformat::detail::formatImpl(std::ostream &, const char *, const detail::FormatArg *, int)"
                   );
    }
    pcVar5 = printFormatStringLiteral(out,fmt);
    pFVar4 = local_1d0;
    local_1fa = false;
    local_1f8 = -1;
    fmt = streamStateFromFormat(out,&local_1fa,&local_1f8,pcVar5,local_1d0,&local_1f4,numFormatters)
    ;
    lVar6 = (long)local_1f4;
    if (numFormatters <= local_1f4) break;
    if (local_1fa == false) {
      FormatArg::format(pFVar4 + lVar6,out,pcVar5,fmt,local_1f8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ios::copyfmt((ios *)((ostringstream *)local_1a8 + *(long *)(local_1a8[0] + -0x18)));
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 0x800;
      FormatArg::format(pFVar4 + lVar6,(ostream *)local_1a8,pcVar5,fmt,local_1f8);
      std::__cxx11::stringbuf::str();
      out = local_1d8;
      numFormatters = local_1ec;
      for (lVar6 = 0; local_1c0 != lVar6; lVar6 = lVar6 + 1) {
        if (*(char *)(local_1c8 + lVar6) == '+') {
          *(undefined1 *)(local_1c8 + lVar6) = 0x20;
        }
      }
      std::operator<<(local_1d8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    local_1f4 = local_1f4 + 1;
  }
  __assert_fail("0 && \"tinyformat: Not enough format arguments\"",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                ,0x326,
                "void tinyformat::detail::formatImpl(std::ostream &, const char *, const detail::FormatArg *, int)"
               );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* formatters,
                       int numFormatters)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    for (int argIndex = 0; argIndex < numFormatters; ++argIndex)
    {
        // Parse the format string
        fmt = printFormatStringLiteral(out, fmt);
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, spacePadPositive, ntrunc, fmt,
                                                   formatters, argIndex, numFormatters);
        if (argIndex >= numFormatters)
        {
            // Check args remain after reading any variable width/precision
            TINYFORMAT_ERROR("tinyformat: Not enough format arguments");
            return;
        }
        const FormatArg& arg = formatters[argIndex];
        // Format the arg into the stream.
        if(!spacePadPositive)
            arg.format(out, fmt, fmtEnd, ntrunc);
        else
        {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for(size_t i = 0, iend = result.size(); i < iend; ++i)
                if(result[i] == '+') result[i] = ' ';
            out << result;
        }
        fmt = fmtEnd;
    }

    // Print remaining part of format string.
    fmt = printFormatStringLiteral(out, fmt);
    if(*fmt != '\0')
        TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}